

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O0

void __thiscall
aeron::ClientConductor::onSubscriptionReady
          (ClientConductor *this,int64_t registrationId,int32_t channelStatusId)

{
  __normal_iterator<aeron::ClientConductor::SubscriptionStateDefn_*,_std::vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>_>
  __first;
  bool bVar1;
  reference pSVar2;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_long)>
  *in_RDI;
  SubscriptionStateDefn *state;
  __normal_iterator<aeron::ClientConductor::SubscriptionStateDefn_*,_std::vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>_>
  subIt;
  lock_guard<std::recursive_mutex> lock;
  mutex_type *in_stack_ffffffffffffff48;
  shared_ptr<aeron::Subscription> *__r;
  __normal_iterator<aeron::ClientConductor::SubscriptionStateDefn_*,_std::vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>_>
  *in_stack_ffffffffffffff50;
  weak_ptr<aeron::Subscription> *this_00;
  int __args_1;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 uVar3;
  anon_class_8_1_0d1909f2_for__M_pred __pred;
  __normal_iterator<aeron::ClientConductor::SubscriptionStateDefn_*,_std::vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>_>
  in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  element_type *in_stack_ffffffffffffff80;
  __weak_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff88;
  element_type *in_stack_ffffffffffffff90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff98;
  __normal_iterator<aeron::ClientConductor::SubscriptionStateDefn_*,_std::vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>_>
  local_28 [5];
  
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48
            );
  __pred.registrationId = (int64_t)(in_RDI + 3);
  std::
  vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
  ::begin((vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
           *)in_stack_ffffffffffffff48);
  std::
  vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
  ::end((vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
         *)in_stack_ffffffffffffff48);
  __first._M_current._4_4_ = in_stack_ffffffffffffff7c;
  __first._M_current._0_4_ = in_stack_ffffffffffffff78;
  local_28[0] = std::
                find_if<__gnu_cxx::__normal_iterator<aeron::ClientConductor::SubscriptionStateDefn*,std::vector<aeron::ClientConductor::SubscriptionStateDefn,std::allocator<aeron::ClientConductor::SubscriptionStateDefn>>>,aeron::ClientConductor::onSubscriptionReady(long,int)::__0>
                          (__first,in_stack_ffffffffffffff70,__pred);
  std::
  vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
  ::end((vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
         *)in_stack_ffffffffffffff48);
  bVar1 = __gnu_cxx::operator!=
                    (in_stack_ffffffffffffff50,
                     (__normal_iterator<aeron::ClientConductor::SubscriptionStateDefn_*,_std::vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>_>
                      *)in_stack_ffffffffffffff48);
  uVar3 = false;
  if (bVar1) {
    pSVar2 = __gnu_cxx::
             __normal_iterator<aeron::ClientConductor::SubscriptionStateDefn_*,_std::vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>_>
             ::operator*(local_28);
    uVar3 = pSVar2->m_status == AWAITING_MEDIA_DRIVER;
  }
  if ((bool)uVar3 != false) {
    pSVar2 = __gnu_cxx::
             __normal_iterator<aeron::ClientConductor::SubscriptionStateDefn_*,_std::vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>_>
             ::operator*(local_28);
    pSVar2->m_status = REGISTERED_MEDIA_DRIVER;
    std::
    make_shared<aeron::Subscription,aeron::ClientConductor&,long&,std::__cxx11::string&,int&,int&>
              ((ClientConductor *)in_stack_ffffffffffffff98._M_pi,(long *)in_stack_ffffffffffffff90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff88._M_pi,(int *)in_stack_ffffffffffffff80,
               (int *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    __r = (shared_ptr<aeron::Subscription> *)&stack0xffffffffffffff90;
    std::shared_ptr<aeron::Subscription>::operator=(&pSVar2->m_subscriptionCache,__r);
    std::shared_ptr<aeron::Subscription>::~shared_ptr(__r);
    this_00 = (weak_ptr<aeron::Subscription> *)&stack0xffffffffffffff80;
    std::weak_ptr<aeron::Subscription>::weak_ptr<aeron::Subscription,void>(this_00,__r);
    std::weak_ptr<aeron::Subscription>::operator=(this_00,(weak_ptr<aeron::Subscription> *)__r);
    __args_1 = (int)((ulong)this_00 >> 0x20);
    std::weak_ptr<aeron::Subscription>::~weak_ptr((weak_ptr<aeron::Subscription> *)0x1cd1ac);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_long)>
    ::operator()(in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT17(uVar3,in_stack_ffffffffffffff58),__args_1,(long)__r);
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1cd20b);
  return;
}

Assistant:

void ClientConductor::onSubscriptionReady(
    std::int64_t registrationId,
    std::int32_t channelStatusId)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    auto subIt = std::find_if(m_subscriptions.begin(), m_subscriptions.end(),
        [registrationId](const SubscriptionStateDefn &entry)
        {
            return registrationId == entry.m_registrationId;
        });

    if (subIt != m_subscriptions.end() && (*subIt).m_status == RegistrationStatus::AWAITING_MEDIA_DRIVER)
    {
        SubscriptionStateDefn& state = (*subIt);

        state.m_status = RegistrationStatus::REGISTERED_MEDIA_DRIVER;
        state.m_subscriptionCache = std::make_shared<Subscription>(
            *this, state.m_registrationId, state.m_channel, state.m_streamId, channelStatusId);
        state.m_subscription = std::weak_ptr<Subscription>(state.m_subscriptionCache);
        m_onNewSubscriptionHandler(state.m_channel, state.m_streamId, registrationId);
        return;
    }
}